

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O2

int __thiscall
SID::clock_resample_interpolate(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  int iVar1;
  uint uVar2;
  short *psVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  int i;
  int iVar7;
  int iVar8;
  int iVar9;
  int j;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar11 = this->sample_offset;
  iVar7 = 0;
  do {
    uVar11 = uVar11 + this->cycles_per_sample;
    iVar10 = (int)uVar11 >> 0x10;
    iVar1 = *delta_t;
    iVar12 = iVar7;
    if (iVar1 < iVar10) break;
    if (n <= iVar7) {
      return iVar7;
    }
    iVar12 = 0;
    if (0 < iVar10) {
      iVar12 = iVar10;
    }
    while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
      clock(this);
      iVar8 = (this->extfilt).Vo;
      sVar4 = (short)(iVar8 / 0xb);
      if (iVar8 < -0x5800a) {
        sVar4 = -0x8000;
      }
      if (0x57fff < iVar8) {
        sVar4 = 0x7fff;
      }
      psVar3 = this->sample;
      iVar8 = this->sample_index;
      psVar3[(long)iVar8 + 0x4000] = sVar4;
      psVar3[iVar8] = sVar4;
      this->sample_index = iVar8 + 1U & 0x3fff;
    }
    *delta_t = *delta_t - iVar10;
    uVar11 = uVar11 & 0xffff;
    this->sample_offset = uVar11;
    iVar12 = this->fir_RES;
    iVar8 = (int)(iVar12 * uVar11) >> 0x10;
    uVar2 = this->fir_N;
    uVar13 = 0;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    iVar5 = 0;
    for (; uVar6 != uVar13; uVar13 = uVar13 + 1) {
      iVar5 = iVar5 + (int)this->fir[(long)(int)(iVar8 * uVar2) + uVar13] *
                      (int)this->sample
                           [(long)this->sample_index + ((uVar13 + 0x4000) - (long)(int)uVar2)];
    }
    iVar8 = iVar8 + 1;
    uVar13 = 0;
    bVar14 = iVar8 != iVar12;
    if (!bVar14) {
      iVar8 = 0;
    }
    iVar9 = 0;
    for (; uVar6 != uVar13; uVar13 = uVar13 + 1) {
      iVar9 = iVar9 + (int)this->fir[(long)(int)(iVar8 * uVar2) + uVar13] *
                      (int)this->sample
                           [(long)this->sample_index +
                            (((ulong)bVar14 + uVar13 + 0x3fff) - (long)(int)uVar2)];
    }
    iVar12 = ((int)((iVar9 - iVar5) * (iVar12 * uVar11 & 0xffff)) >> 0x10) + iVar5 >> 0xf;
    if (iVar12 < -0x7fff) {
      iVar12 = -0x8000;
    }
    sVar4 = (short)iVar12;
    if (0x7ffe < iVar12) {
      sVar4 = 0x7fff;
    }
    iVar12 = iVar7 + 1;
    buf[iVar7 * interleave] = sVar4;
    iVar7 = iVar12;
  } while (iVar10 <= iVar1);
  for (iVar7 = 0; iVar7 < *delta_t; iVar7 = iVar7 + 1) {
    clock(this);
    iVar1 = (this->extfilt).Vo;
    sVar4 = (short)(iVar1 / 0xb);
    if (iVar1 < -0x5800a) {
      sVar4 = -0x8000;
    }
    if (0x57fff < iVar1) {
      sVar4 = 0x7fff;
    }
    psVar3 = this->sample;
    iVar1 = this->sample_index;
    psVar3[(long)iVar1 + 0x4000] = sVar4;
    psVar3[iVar1] = sVar4;
    this->sample_index = iVar1 + 1U & 0x3fff;
  }
  this->sample_offset = this->sample_offset + *delta_t * -0x10000;
  *delta_t = 0;
  return iVar12;
}

Assistant:

RESID_INLINE
int SID::clock_resample_interpolate(cycle_count& delta_t, short* buf, int n,
				    int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    int fir_offset_rmd = sample_offset*fir_RES & FIXP_MASK;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v1 = 0;
    for (int j = 0; j < fir_N; j++) {
      v1 += sample_start[j]*fir_start[j];
    }

    // Use next FIR table, wrap around to first FIR table using
    // previous sample.
    if (++fir_offset == fir_RES) {
      fir_offset = 0;
      --sample_start;
    }
    fir_start = fir + fir_offset*fir_N;

    // Convolution with filter impulse response.
    int v2 = 0;
    for (int j = 0; j < fir_N; j++) {
      v2 += sample_start[j]*fir_start[j];
    }

    // Linear interpolation.
    // fir_offset_rmd is equal for all samples, it can thus be factorized out:
    // sum(v1 + rmd*(v2 - v1)) = sum(v1) + rmd*(sum(v2) - sum(v1))
    int v = v1 + (fir_offset_rmd*(v2 - v1) >> FIXP_SHIFT);

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}